

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O2

void __thiscall jaegertracing::SpanContext::swap(SpanContext *this,SpanContext *ctx)

{
  uchar uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  TraceID __tmp;
  
  uVar2 = (this->_traceID)._high;
  uVar3 = (this->_traceID)._low;
  uVar4 = (ctx->_traceID)._low;
  (this->_traceID)._high = (ctx->_traceID)._high;
  (this->_traceID)._low = uVar4;
  (ctx->_traceID)._high = uVar2;
  (ctx->_traceID)._low = uVar3;
  uVar2 = this->_spanID;
  this->_spanID = ctx->_spanID;
  ctx->_spanID = uVar2;
  uVar2 = this->_parentID;
  this->_parentID = ctx->_parentID;
  ctx->_parentID = uVar2;
  uVar1 = this->_flags;
  this->_flags = ctx->_flags;
  ctx->_flags = uVar1;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::swap(&(this->_baggage)._M_h,&(ctx->_baggage)._M_h);
  std::__cxx11::string::swap((string *)&this->_debugID);
  return;
}

Assistant:

void swap(SpanContext& ctx)
    {
        using std::swap;
        swap(_traceID, ctx._traceID);
        swap(_spanID, ctx._spanID);
        swap(_parentID, ctx._parentID);
        swap(_flags, ctx._flags);
        swap(_baggage, ctx._baggage);
        swap(_debugID, ctx._debugID);
    }